

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

bool __thiscall
tsbp::LeftmostActiveOnly::PlaceBottomLeftPlacement
          (LeftmostActiveOnly *this,Node *node,Rectangle *item)

{
  Packing2D *this_00;
  bool bVar1;
  reference __a;
  reference __b;
  unsigned_long *puVar2;
  int *piVar3;
  int local_88;
  int local_84;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long>_> *p_Stack_80;
  int newActiveX_1;
  type_conflict2 *newActiveY;
  type_conflict2 *newActiveX;
  ulong local_60;
  size_t xAboveNewY;
  int placedY;
  int placedX;
  Packing2D *local_30;
  Packing2D *packing;
  Rectangle *item_local;
  Node *node_local;
  LeftmostActiveOnly *this_local;
  
  packing = (Packing2D *)item;
  item_local = (Rectangle *)node;
  node_local = (Node *)this;
  local_30 = std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::operator*
                       (&node->Packing);
  bVar1 = IsPlacementFeasible(this,local_30,(Rectangle *)packing);
  this_00 = local_30;
  if (bVar1) {
    Rectangle::Rectangle
              ((Rectangle *)&placedY,local_30->ActiveX,local_30->ActiveY,(int)packing->MinX,
               *(int *)((long)&packing->MinX + 4),packing->MaxX,packing->AbscissaMaxX);
    Packing2D::AddItem(this_00,(Rectangle *)&placedY,item_local->X);
    xAboveNewY._4_4_ = local_30->ActiveX;
    xAboveNewY._0_4_ = local_30->ActiveY;
    AddSuccessfulPlacementDummy(this,local_30);
    __a = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&local_30->PlacedAreaVector,
                     (long)((int)xAboveNewY + *(int *)((long)&packing->MinX + 4)));
    __b = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&local_30->DeactivatedAreaVector,
                     (long)((int)xAboveNewY + *(int *)((long)&packing->MinX + 4)));
    puVar2 = CLI::std::max<unsigned_long>(__a,__b);
    local_60 = *puVar2;
    if (((int)xAboveNewY + *(int *)((long)&packing->MinX + 4) ==
         (this->container).super_Rectangle.Dy) ||
       ((ulong)(long)(xAboveNewY._4_4_ + (int)packing->MinX) < local_60)) {
      FindNewBottomLeft((LeftmostActiveOnly *)&newActiveX,(Packing2D *)this);
      newActiveY = std::get<0ul,unsigned_long,unsigned_long>
                             ((tuple<unsigned_long,_unsigned_long> *)&newActiveX);
      p_Stack_80 = std::get<1ul,unsigned_long,unsigned_long>
                             ((tuple<unsigned_long,_unsigned_long> *)&newActiveX);
      local_30->ActiveX = (int)*newActiveY;
      local_30->ActiveY = (int)*p_Stack_80;
    }
    else {
      local_84 = (int)local_60;
      local_30->ActiveX = local_84;
      local_30->ActiveY = *(int *)((long)&packing->MinX + 4) + local_30->ActiveY;
    }
    local_88 = xAboveNewY._4_4_ + (int)packing->MinX;
    piVar3 = CLI::std::max<int>(&local_30->MaxX,&local_88);
    local_30->MaxX = *piVar3;
    if ((int)xAboveNewY == 0) {
      if (xAboveNewY._4_4_ + (int)packing->MinX <= local_30->AbscissaMaxX) {
        __assert_fail("placedX + item.Dx > packing.AbscissaMaxX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/tsbp/src/BranchAndBound.cpp"
                      ,0x4ae,
                      "bool tsbp::LeftmostActiveOnly::PlaceBottomLeftPlacement(Node &, const Rectangle &)"
                     );
      }
      local_30->AbscissaMaxX = xAboveNewY._4_4_ + (int)packing->MinX;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LeftmostActiveOnly::PlaceBottomLeftPlacement(Node& node, const Rectangle& item)
{
    Packing2D& packing = *node.Packing;

    if (IsPlacementFeasible(packing, item))
    {
        packing.AddItem(Rectangle{packing.ActiveX, packing.ActiveY, item.Dx, item.Dy, item.InternId, item.ExternId}, node.ItemIdToPlace);

        int placedX = packing.ActiveX;
        int placedY = packing.ActiveY;

        // Add dummy item for area left of current placement.
        AddSuccessfulPlacementDummy(packing);

        size_t xAboveNewY = std::max<size_t>(packing.PlacedAreaVector[placedY + item.Dy], packing.DeactivatedAreaVector[placedY + item.Dy]);

        if (placedY + item.Dy == this->container.Dy || xAboveNewY > placedX + item.Dx)
        {
            auto [newActiveX, newActiveY] = FindNewBottomLeft(packing);

            packing.ActiveX = newActiveX;
            packing.ActiveY = newActiveY;
        }
        else
        {
            int newActiveX = xAboveNewY;

            packing.ActiveX = newActiveX;
            packing.ActiveY += item.Dy;
        }

        packing.MaxX = std::max<int>(packing.MaxX, placedX + item.Dx);
        if (placedY == 0)
        {
            assert(placedX + item.Dx > packing.AbscissaMaxX);
            packing.AbscissaMaxX = placedX + item.Dx;
        }

        return true;
    }

    // Placement was infeasible: Prune node, deactivate placement i, activate placement ii.
    return false;
}